

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilePOSIX.cpp
# Opt level: O2

void __thiscall
adios2::transport::FilePOSIX::Write(FilePOSIX *this,char *buffer,size_t size,size_t start)

{
  int *piVar1;
  size_t sVar2;
  ulong uVar3;
  bool bVar4;
  allocator local_173;
  allocator local_172;
  allocator local_171;
  anon_class_8_1_8991fb9c lf_Write;
  string local_168;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  lf_Write.this = this;
  WaitForOpen(this);
  if (start == 0xffffffffffffffff) {
    lseek(this->m_FileDescriptor,0,1);
  }
  else {
    piVar1 = __errno_location();
    *piVar1 = 0;
    sVar2 = lseek(this->m_FileDescriptor,start,0);
    this->m_Errno = *piVar1;
    if (sVar2 != start) {
      std::__cxx11::string::string((string *)&local_48,"Toolkit",&local_171);
      std::__cxx11::string::string((string *)&local_68,"transport::file::FilePOSIX",&local_172);
      std::__cxx11::string::string((string *)&local_88,"Write",&local_173);
      std::__cxx11::to_string(&local_148,start);
      std::operator+(&local_128,"couldn\'t move to start position ",&local_148);
      std::operator+(&local_108,&local_128," in file ");
      std::operator+(&local_e8,&local_108,&(this->super_Transport).m_Name);
      std::operator+(&local_c8,&local_e8," ");
      SysErrMsg_abi_cxx11_(&local_168,this);
      std::operator+(&local_a8,&local_c8,&local_168);
      helper::Throw<std::ios_base::failure[abi:cxx11]>(&local_48,&local_68,&local_88,&local_a8,-1);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_48);
    }
  }
  if (0x7ffe7000 < size) {
    uVar3 = size / 0x7ffe7000;
    size = size % 0x7ffe7000;
    while (bVar4 = uVar3 != 0, uVar3 = uVar3 - 1, bVar4) {
      Write::anon_class_8_1_8991fb9c::operator()(&lf_Write,buffer,0x7ffe7000);
      buffer = buffer + 0x7ffe7000;
    }
  }
  Write::anon_class_8_1_8991fb9c::operator()(&lf_Write,buffer,size);
  return;
}

Assistant:

void FilePOSIX::Write(const char *buffer, size_t size, size_t start)
{
    auto lf_Write = [&](const char *buffer, size_t size) {
        while (size > 0)
        {
            ProfilerStart("write");
            ProfilerWriteBytes(size);
            errno = 0;
            const auto writtenSize = write(m_FileDescriptor, buffer, size);
            m_Errno = errno;
            ProfilerStop("write");

            if (writtenSize == -1)
            {
                if (errno == EINTR)
                {
                    continue;
                }

                helper::Throw<std::ios_base::failure>(
                    "Toolkit", "transport::file::FilePOSIX", "Write",
                    "couldn't write to file " + m_Name + " " + SysErrMsg());
            }

            buffer += writtenSize;
            size -= writtenSize;
        }
    };

    WaitForOpen();
    if (start != MaxSizeT)
    {
        errno = 0;
        const auto newPosition = lseek(m_FileDescriptor, start, SEEK_SET);
        m_Errno = errno;

        if (static_cast<size_t>(newPosition) != start)
        {
            helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FilePOSIX", "Write",
                                                  "couldn't move to start position " +
                                                      std::to_string(start) + " in file " + m_Name +
                                                      " " + SysErrMsg());
        }
    }
    else
    {
        const auto pos = lseek(m_FileDescriptor, 0, SEEK_CUR);
        start = static_cast<size_t>(pos);
    }

    if (size > DefaultMaxFileBatchSize)
    {
        const size_t batches = size / DefaultMaxFileBatchSize;
        const size_t remainder = size % DefaultMaxFileBatchSize;

        size_t position = 0;
        for (size_t b = 0; b < batches; ++b)
        {
            lf_Write(&buffer[position], DefaultMaxFileBatchSize);
            position += DefaultMaxFileBatchSize;
        }
        lf_Write(&buffer[position], remainder);
    }
    else
    {
        lf_Write(buffer, size);
    }
}